

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedBindingUpdate::Run(AdvancedBindingUpdate *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  float *pfVar8;
  long lVar9;
  CallLogWrapper *pCVar10;
  Vector<float,_3> local_1ac;
  Vector<float,_3> local_1a0;
  Vector<float,_3> local_194;
  Vector<float,_3> local_188;
  uint local_17c;
  GLuint i_3;
  undefined4 local_16c;
  Vector<float,_3> local_168 [2];
  allocator<tcu::Vector<float,_3>_> local_149;
  undefined1 local_148 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  bool status;
  undefined8 uStack_128;
  GLuint i_2;
  GLuint data_1 [4];
  GLushort data [4];
  Vector<double,_3> local_108;
  Vector<float,_2> local_ec;
  int local_e4;
  Vector<float,_2> VStack_e0;
  int i_1;
  Vector<float,_2> local_d8;
  Vector<float,_2> local_d0;
  Vector<float,_2> local_c8;
  void *local_c0;
  GLubyte *ptr_1;
  Vector<double,_3> local_b0;
  Vector<float,_2> local_94;
  int local_8c;
  Vector<float,_2> VStack_88;
  int i;
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  void *local_68;
  GLubyte *ptr;
  anon_union_24_2_94730042 u;
  GLintptr kOffset [2];
  GLsizei kStride [2];
  char *glsl_fs;
  char *glsl_vs;
  AdvancedBindingUpdate *this_local;
  
  glsl_fs = 
  "#version 430 core\nlayout(location = 0) in vec4 vs_in_position;\nlayout(location = 1) in vec2 vs_in_color_rg;\nlayout(location = 2) in float vs_in_color_b;\nlayout(location = 3) in dvec3 vs_in_data0;\nlayout(location = 4) in ivec2 vs_in_data1;\nout StageData {\n  vec2 color_rg;\n  float color_b;\n  dvec3 data0;\n  ivec2 data1;\n} vs_out;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nvoid main() {\n  vs_out.data1 = vs_in_data1;\n  vs_out.data0 = vs_in_data0;\n  vs_out.color_b = vs_in_color_b;\n  vs_out.color_rg = vs_in_color_rg;\n  gl_Position = vs_in_position;\n}"
  ;
  kStride = (GLsizei  [2])anon_var_dwarf_2b47ab;
  glsl_vs = (char *)this;
  GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b31,1,&glsl_fs);
  this->m_vsp = GVar2;
  GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b30,1,(GLchar **)kStride);
  this->m_fsp = GVar2;
  bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_vsp);
  if ((bVar1) &&
     (bVar1 = VertexAttribBindingBase::CheckProgram
                        (&this->super_VertexAttribBindingBase,this->m_fsp), bVar1)) {
    glu::CallLogWrapper::glUseProgramStages
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo,1,this->m_vsp);
    glu::CallLogWrapper::glUseProgramStages
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo,2,this->m_fsp);
    u.d[2] = 0.0;
    kOffset[0] = 8;
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->m_vbo[0]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,(long)u.d[2] + 0xd0,(void *)0x0,0x88e4);
    local_68 = glu::CallLogWrapper::glMapBuffer
                         (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x8892,0x88b9);
    tcu::Vector<float,_2>::Vector(&local_70,-1.0,-1.0);
    *(float (*) [2])((long)local_68 + (long)u.d[2]) = local_70.m_data;
    tcu::Vector<float,_2>::Vector(&local_78,1.0,-1.0);
    *(float (*) [2])((long)local_68 + (long)u.d[2] + 0x34) = local_78.m_data;
    tcu::Vector<float,_2>::Vector(&local_80,1.0,1.0);
    *(float (*) [2])((long)local_68 + (long)u.d[2] + 0x68) = local_80.m_data;
    tcu::Vector<float,_2>::Vector(&stack0xffffffffffffff78,-1.0,1.0);
    *(float (*) [2])((long)local_68 + (long)u.d[2] + 0x9c) = VStack_88.m_data;
    for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
      tcu::Vector<float,_2>::Vector(&local_94,0.0,1.0);
      *(float (*) [2])((long)local_68 + (long)u.d[2] + 8 + (long)(local_8c * 0x34)) =
           local_94.m_data;
      *(undefined4 *)((long)local_68 + (long)u.d[2] + 0x10 + (long)(local_8c * 0x34)) = 0;
      tcu::Vector<double,_3>::Vector(&local_b0,1.0,2.0,3.0);
      ptr = (GLubyte *)local_b0.m_data[0];
      u.d[0] = local_b0.m_data[1];
      u.d[1] = local_b0.m_data[2];
      lVar9 = (long)u.d[2] + 0x14 + (long)(local_8c * 0x34);
      *(double *)((long)local_68 + lVar9) = local_b0.m_data[0];
      *(double *)((long)local_68 + lVar9 + 8) = local_b0.m_data[1];
      *(double *)((long)local_68 + lVar9 + 0x10) = local_b0.m_data[2];
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&ptr_1,1,2);
      *(GLubyte **)((long)local_68 + (long)u.d[2] + 0x2c + (long)(local_8c * 0x34)) = ptr_1;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->m_vbo[1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,kOffset[0] + 0xf8,(void *)0x0,0x88e4);
    local_c0 = glu::CallLogWrapper::glMapBuffer
                         (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x8892,0x88b9);
    tcu::Vector<float,_2>::Vector(&local_c8,-1.0,1.0);
    *(float (*) [2])((long)local_c0 + kOffset[0]) = local_c8.m_data;
    tcu::Vector<float,_2>::Vector(&local_d0,1.0,1.0);
    *(float (*) [2])((long)local_c0 + kOffset[0] + 0x3e) = local_d0.m_data;
    tcu::Vector<float,_2>::Vector(&local_d8,1.0,-1.0);
    *(float (*) [2])((long)local_c0 + kOffset[0] + 0x7c) = local_d8.m_data;
    tcu::Vector<float,_2>::Vector(&stack0xffffffffffffff20,-1.0,-1.0);
    *(float (*) [2])((long)local_c0 + kOffset[0] + 0xba) = VStack_e0.m_data;
    for (local_e4 = 0; local_e4 < 4; local_e4 = local_e4 + 1) {
      tcu::Vector<float,_2>::Vector(&local_ec,0.0,0.0);
      *(float (*) [2])((long)local_c0 + kOffset[0] + 8 + (long)(local_e4 * 0x3e)) = local_ec.m_data;
      *(undefined4 *)((long)local_c0 + kOffset[0] + 0x10 + (long)(local_e4 * 0x3e)) = 0x3f800000;
      tcu::Vector<double,_3>::Vector(&local_108,4.0,5.0,6.0);
      ptr = (GLubyte *)local_108.m_data[0];
      u.d[0] = local_108.m_data[1];
      u.d[1] = local_108.m_data[2];
      lVar9 = kOffset[0] + 0x14 + (long)(local_e4 * 0x3e);
      *(double *)((long)local_c0 + lVar9) = local_108.m_data[0];
      *(double *)((long)local_c0 + lVar9 + 8) = local_108.m_data[1];
      *(double *)((long)local_c0 + lVar9 + 0x10) = local_108.m_data[2];
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)data,3,4);
      *(GLushort (*) [4])((long)local_c0 + kOffset[0] + 0x2c + (long)(local_e4 * 0x3e)) = data;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,this->m_ebo[0]);
    data_1[2] = 0x10000;
    data_1[3] = 0x20003;
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,8,data_1 + 2,0x88e4);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,this->m_ebo[1]);
    uStack_128 = 0x200000003;
    data_1[0] = 0;
    data_1[1] = 1;
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,0x10,&stack0xfffffffffffffed8,0x88e4);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,0);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao[0]);
    glu::CallLogWrapper::glVertexAttribFormat
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,2,0x1406,'\0',0);
    glu::CallLogWrapper::glVertexAttribFormat
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,2,0x1406,'\0',8);
    glu::CallLogWrapper::glVertexAttribFormat
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,2,1,0x1406,'\0',0x10);
    glu::CallLogWrapper::glVertexAttribLFormat
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,3,3,0x140a,0x14);
    glu::CallLogWrapper::glVertexAttribIFormat
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,2,0x1404,0x2c);
    for (fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 5;
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      glu::CallLogWrapper::glVertexAttribBinding
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,
                 fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0);
      glu::CallLogWrapper::glEnableVertexAttribArray
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,
                 fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    }
    pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glBindVertexArray(pCVar10,this->m_vao[1]);
    glu::CallLogWrapper::glVertexAttribFormat(pCVar10,0,2,0x1406,'\0',0);
    glu::CallLogWrapper::glVertexAttribFormat(pCVar10,1,2,0x1406,'\0',8);
    glu::CallLogWrapper::glVertexAttribFormat(pCVar10,2,1,0x1406,'\0',0x10);
    glu::CallLogWrapper::glVertexAttribLFormat(pCVar10,3,3,0x140a,0x14);
    glu::CallLogWrapper::glVertexAttribIFormat(pCVar10,4,2,0x1404,0x2c);
    glu::CallLogWrapper::glVertexAttribBinding(pCVar10,0,1);
    glu::CallLogWrapper::glVertexAttribBinding(pCVar10,1,8);
    glu::CallLogWrapper::glVertexAttribBinding(pCVar10,2,1);
    glu::CallLogWrapper::glVertexAttribBinding(pCVar10,3,1);
    glu::CallLogWrapper::glVertexAttribBinding(pCVar10,4,8);
    glu::CallLogWrapper::glEnableVertexAttribArray(pCVar10,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(pCVar10,1);
    glu::CallLogWrapper::glEnableVertexAttribArray(pCVar10,2);
    glu::CallLogWrapper::glEnableVertexAttribArray(pCVar10,3);
    glu::CallLogWrapper::glEnableVertexAttribArray(pCVar10,4);
    glu::CallLogWrapper::glBindVertexBuffer(pCVar10,1,this->m_vbo[1],kOffset[0],0x3e);
    glu::CallLogWrapper::glBindVertexBuffer(pCVar10,8,this->m_vbo[0],(GLintptr)u.d[2],0x34);
    glu::CallLogWrapper::glBindBuffer(pCVar10,0x8893,this->m_ebo[1]);
    glu::CallLogWrapper::glBindVertexArray(pCVar10,0);
    glu::CallLogWrapper::glClear(pCVar10,0x4000);
    glu::CallLogWrapper::glBindProgramPipeline(pCVar10,this->m_ppo);
    glu::CallLogWrapper::glBindVertexArray(pCVar10,this->m_vao[0]);
    GVar2 = this->m_fsp;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data0");
    glu::CallLogWrapper::glProgramUniform3d(pCVar10,GVar2,GVar3,1.0,2.0,3.0);
    GVar2 = this->m_fsp;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data1");
    glu::CallLogWrapper::glProgramUniform2i(pCVar10,GVar2,GVar3,1,2);
    glu::CallLogWrapper::glBindVertexBuffer(pCVar10,0,this->m_vbo[0],(GLintptr)u.d[2],0x34);
    glu::CallLogWrapper::glBindBuffer(pCVar10,0x8893,this->m_ebo[0]);
    glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
              (pCVar10,5,4,0x1403,(void *)0x0,1,0,0);
    fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
    iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
    std::allocator<tcu::Vector<float,_3>_>::allocator(&local_149);
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_148,
               (long)(iVar4 * iVar5),&local_149);
    std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_149);
    iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
    iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
    pvVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_148,0);
    pfVar8 = tcu::Vector<float,_3>::operator[](pvVar7,0);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,iVar4,iVar5,0x1907,0x1406,pfVar8);
    iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
    iVar5 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
    iVar6 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
    tcu::Vector<float,_3>::Vector(local_168,0.0,1.0,0.0);
    bVar1 = VertexAttribBindingBase::CheckRectColor
                      (&this->super_VertexAttribBindingBase,
                       (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       local_148,iVar4,0,0,iVar5,iVar6,local_168);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    }
    if ((fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
      this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
    }
    else {
      pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      GVar2 = this->m_fsp;
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data0");
      glu::CallLogWrapper::glProgramUniform3d(pCVar10,GVar2,GVar3,4.0,5.0,6.0);
      pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      GVar2 = this->m_fsp;
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data1");
      glu::CallLogWrapper::glProgramUniform2i(pCVar10,GVar2,GVar3,3,4);
      glu::CallLogWrapper::glBindVertexBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,this->m_vbo[1],kOffset[0],0x3e);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8893,this->m_ebo[1]);
      glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,4,0x1405,(void *)0x0,1,0,0);
      iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
      iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
      pvVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_148,0);
      pfVar8 = tcu::Vector<float,_3>::operator[](pvVar7,0);
      glu::CallLogWrapper::glReadPixels
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,iVar4,iVar5,0x1907,0x1406,pfVar8);
      iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
      iVar5 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
      iVar6 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&stack0xfffffffffffffe88,0.0,0.0,1.0);
      bVar1 = VertexAttribBindingBase::CheckRectColor
                        (&this->super_VertexAttribBindingBase,
                         (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                         local_148,iVar4,0,0,iVar5,iVar6,(Vec3 *)&stack0xfffffffffffffe88);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      }
      if ((fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
        this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
      }
      else {
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,0,0);
        pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                   super_CallLogWrapper;
        GVar2 = this->m_fsp;
        GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data0");
        glu::CallLogWrapper::glProgramUniform3d(pCVar10,GVar2,GVar3,1.0,2.0,3.0);
        pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                   super_CallLogWrapper;
        GVar2 = this->m_fsp;
        GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data1");
        glu::CallLogWrapper::glProgramUniform2i(pCVar10,GVar2,GVar3,1,2);
        for (local_17c = 0; local_17c < 5; local_17c = local_17c + 1) {
          glu::CallLogWrapper::glVertexAttribBinding
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_17c,0xf);
        }
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xf,this->m_vbo[0],(GLintptr)u.d[2],0x34);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8893,this->m_ebo[0]);
        glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,4,0x1403,(void *)0x0,1,0,0);
        iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
        iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
        pvVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_148,0);
        pfVar8 = tcu::Vector<float,_3>::operator[](pvVar7,0);
        glu::CallLogWrapper::glReadPixels
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,iVar4,iVar5,0x1907,0x1406,pfVar8);
        iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
        iVar5 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
        iVar6 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
        tcu::Vector<float,_3>::Vector(&local_188,0.0,1.0,0.0);
        bVar1 = VertexAttribBindingBase::CheckRectColor
                          (&this->super_VertexAttribBindingBase,
                           (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )local_148,iVar4,0,0,iVar5,iVar6,&local_188);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
        }
        if ((fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
          this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
        }
        else {
          glu::CallLogWrapper::glBindVertexBuffer
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0xf,0,0,0);
          pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                     super_CallLogWrapper;
          GVar2 = this->m_fsp;
          GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data0");
          glu::CallLogWrapper::glProgramUniform3d(pCVar10,GVar2,GVar3,1.0,2.0,3.0);
          pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                     super_CallLogWrapper;
          GVar2 = this->m_fsp;
          GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data1");
          glu::CallLogWrapper::glProgramUniform2i(pCVar10,GVar2,GVar3,3,4);
          glu::CallLogWrapper::glBindVertexBuffer
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,7,this->m_vbo[0],(GLintptr)u.d[2],0x34);
          glu::CallLogWrapper::glBindVertexBuffer
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0xc,this->m_vbo[1],kOffset[0],0x3e);
          glu::CallLogWrapper::glVertexAttribBinding
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,7);
          glu::CallLogWrapper::glVertexAttribBinding
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,0xc);
          glu::CallLogWrapper::glVertexAttribBinding
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,2,0xc);
          glu::CallLogWrapper::glVertexAttribBinding
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,3,7);
          glu::CallLogWrapper::glVertexAttribBinding
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,4,0xc);
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8893,this->m_ebo[0]);
          glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,5,4,0x1403,(void *)0x0,1,0,0);
          iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
          iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
          pvVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                   operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)local_148,0);
          pfVar8 = tcu::Vector<float,_3>::operator[](pvVar7,0);
          glu::CallLogWrapper::glReadPixels
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,0,iVar4,iVar5,0x1907,0x1406,pfVar8);
          iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
          iVar5 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
          iVar6 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
          tcu::Vector<float,_3>::Vector(&local_194,0.0,0.0,1.0);
          bVar1 = VertexAttribBindingBase::CheckRectColor
                            (&this->super_VertexAttribBindingBase,
                             (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_148,iVar4,0,0,iVar5,iVar6,&local_194);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
          }
          if ((fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
            this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
          }
          else {
            glu::CallLogWrapper::glClear
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x4000);
            pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper;
            GVar2 = this->m_fsp;
            GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data1");
            glu::CallLogWrapper::glProgramUniform2i(pCVar10,GVar2,GVar3,0,0);
            glu::CallLogWrapper::glDisableVertexAttribArray
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,4);
            glu::CallLogWrapper::glVertexAttribI4i
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,4,0,0,0,0);
            glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,5,4,0x1403,(void *)0x0,1,0,0);
            iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
            iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
            pvVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                     operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 *)local_148,0);
            pfVar8 = tcu::Vector<float,_3>::operator[](pvVar7,0);
            glu::CallLogWrapper::glReadPixels
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0,0,iVar4,iVar5,0x1907,0x1406,pfVar8);
            iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
            iVar5 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
            iVar6 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
            tcu::Vector<float,_3>::Vector(&local_1a0,0.0,0.0,1.0);
            bVar1 = VertexAttribBindingBase::CheckRectColor
                              (&this->super_VertexAttribBindingBase,
                               (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                *)local_148,iVar4,0,0,iVar5,iVar6,&local_1a0);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
            }
            if ((fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
              this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
            }
            else {
              pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper;
              GVar2 = this->m_fsp;
              GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data0");
              glu::CallLogWrapper::glProgramUniform3d(pCVar10,GVar2,GVar3,4.0,5.0,6.0);
              pCVar10 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper;
              GVar2 = this->m_fsp;
              GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar10,GVar2,"g_expected_data1");
              glu::CallLogWrapper::glProgramUniform2i(pCVar10,GVar2,GVar3,1,2);
              glu::CallLogWrapper::glBindVertexArray
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,this->m_vao[1]);
              glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,5,4,0x1405,(void *)0x0,1,0,0);
              iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
              iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase)
              ;
              pvVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                       operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)local_148,0);
              pfVar8 = tcu::Vector<float,_3>::operator[](pvVar7,0);
              glu::CallLogWrapper::glReadPixels
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0,0,iVar4,iVar5,0x1907,0x1406,pfVar8);
              iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
              iVar5 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
              iVar6 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase)
              ;
              tcu::Vector<float,_3>::Vector(&local_1ac,0.0,1.0,1.0);
              bVar1 = VertexAttribBindingBase::CheckRectColor
                                (&this->super_VertexAttribBindingBase,
                                 (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)local_148,iVar4,0,0,iVar5,iVar6,&local_1ac);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                fb.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
              }
              if ((fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
                this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
              }
              else {
                this_local = (AdvancedBindingUpdate *)0x0;
              }
            }
          }
        }
      }
    }
    local_16c = 1;
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_148);
  }
  else {
    this_local = (AdvancedBindingUpdate *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "layout(location = 0) in vec4 vs_in_position;" NL
			"layout(location = 1) in vec2 vs_in_color_rg;" NL "layout(location = 2) in float vs_in_color_b;" NL
			"layout(location = 3) in dvec3 vs_in_data0;" NL "layout(location = 4) in ivec2 vs_in_data1;" NL
			"out StageData {" NL "  vec2 color_rg;" NL "  float color_b;" NL "  dvec3 data0;" NL "  ivec2 data1;" NL
			"} vs_out;" NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "void main() {" NL
			"  vs_out.data1 = vs_in_data1;" NL "  vs_out.data0 = vs_in_data0;" NL "  vs_out.color_b = vs_in_color_b;" NL
			"  vs_out.color_rg = vs_in_color_rg;" NL "  gl_Position = vs_in_position;" NL "}";
		const char* const glsl_fs = "#version 430 core" NL "in StageData {" NL "  vec2 color_rg;" NL
									"  float color_b;" NL "  flat dvec3 data0;" NL "  flat ivec2 data1;" NL
									"} fs_in;" NL "layout(location = 0) out vec4 fs_out_color;" NL
									"uniform dvec3 g_expected_data0;" NL "uniform ivec2 g_expected_data1;" NL
									"void main() {" NL "  fs_out_color = vec4(fs_in.color_rg, fs_in.color_b, 1);" NL
									"  if (fs_in.data0 != g_expected_data0) fs_out_color = vec4(1);" NL
									"  if (fs_in.data1 != g_expected_data1) fs_out_color = vec4(1);" NL "}";
		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
			return ERROR;

		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);

		const GLsizei  kStride[2] = { 52, 62 };
		const GLintptr kOffset[2] = { 0, 8 };
		/* Workaround for alignment issue that may result in bus error on some platforms */
		union {
			double d[3];
			char   c[3 * sizeof(double)];
		} u;

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		{
			glBufferData(GL_ARRAY_BUFFER, kOffset[0] + 4 * kStride[0], NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY));

			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 0 * kStride[0]]) = Vec2(-1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 1 * kStride[0]]) = Vec2(1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 2 * kStride[0]]) = Vec2(1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 3 * kStride[0]]) = Vec2(-1.0f, 1.0f);

			for (int i = 0; i < 4; ++i)
			{
				*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 8 + i * kStride[0]])   = Vec2(0.0f, 1.0f);
				*reinterpret_cast<float*>(&ptr[kOffset[0] + 16 + i * kStride[0]]) = 0.0f;
				//*reinterpret_cast<DVec3 *>(&ptr[kOffset[0] + 20 + i * kStride[0]]) = DVec3(1.0, 2.0, 3.0);

				memcpy(u.d, DVec3(1.0, 2.0, 3.0).m_data, 3 * sizeof(double));
				memcpy(&ptr[kOffset[0] + 20 + i * kStride[0]], u.c, 3 * sizeof(double));
				*reinterpret_cast<IVec2*>(&ptr[kOffset[0] + 44 + i * kStride[0]]) = IVec2(1, 2);
			}
			glUnmapBuffer(GL_ARRAY_BUFFER);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		{
			glBufferData(GL_ARRAY_BUFFER, kOffset[1] + 4 * kStride[1], NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY));

			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 0 * kStride[1]]) = Vec2(-1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 1 * kStride[1]]) = Vec2(1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 2 * kStride[1]]) = Vec2(1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 3 * kStride[1]]) = Vec2(-1.0f, -1.0f);

			for (int i = 0; i < 4; ++i)
			{
				*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 8 + i * kStride[1]])   = Vec2(0.0f, 0.0f);
				*reinterpret_cast<float*>(&ptr[kOffset[1] + 16 + i * kStride[1]]) = 1.0f;
				//*reinterpret_cast<DVec3 *>(&ptr[kOffset[1] + 20 + i * kStride[1]]) = DVec3(4.0, 5.0, 6.0);

				memcpy(u.d, DVec3(4.0, 5.0, 6.0).m_data, 3 * sizeof(double));
				memcpy(&ptr[kOffset[1] + 20 + i * kStride[1]], u.c, 3 * sizeof(double));
				*reinterpret_cast<IVec2*>(&ptr[kOffset[1] + 44 + i * kStride[1]]) = IVec2(3, 4);
			}
			glUnmapBuffer(GL_ARRAY_BUFFER);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		{
			GLushort data[4] = { 0, 1, 3, 2 };
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		{
			GLuint data[4] = { 3, 2, 0, 1 };
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao[0]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribLFormat(3, 3, GL_DOUBLE, 20);
		glVertexAttribIFormat(4, 2, GL_INT, 44);

		for (GLuint i = 0; i < 5; ++i)
		{
			glVertexAttribBinding(i, 0);
			glEnableVertexAttribArray(i);
		}
		glBindVertexArray(m_vao[1]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribLFormat(3, 3, GL_DOUBLE, 20);
		glVertexAttribIFormat(4, 2, GL_INT, 44);
		glVertexAttribBinding(0, 1);
		glVertexAttribBinding(1, 8);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(3, 1);
		glVertexAttribBinding(4, 8);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(3);
		glEnableVertexAttribArray(4);
		glBindVertexBuffer(1, m_vbo[1], kOffset[1], kStride[1]);
		glBindVertexBuffer(8, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao[0]);

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 1.0, 2.0, 3.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 1, 2);

		glBindVertexBuffer(0, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0, 0);

		bool			  status = true;
		std::vector<Vec3> fb(getWindowWidth() * getWindowHeight());
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 4.0, 5.0, 6.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 3, 4);

		glBindVertexBuffer(0, m_vbo[1], kOffset[1], kStride[1]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glBindVertexBuffer(0, 0, 0, 0);

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 1.0, 2.0, 3.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 1, 2);

		for (GLuint i = 0; i < 5; ++i)
			glVertexAttribBinding(i, 15);
		glBindVertexBuffer(15, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glBindVertexBuffer(15, 0, 0, 0);

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 1.0, 2.0, 3.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 3, 4);

		glBindVertexBuffer(7, m_vbo[0], kOffset[0], kStride[0]);
		glBindVertexBuffer(12, m_vbo[1], kOffset[1], kStride[1]);
		glVertexAttribBinding(0, 7);
		glVertexAttribBinding(1, 12);
		glVertexAttribBinding(2, 12);
		glVertexAttribBinding(3, 7);
		glVertexAttribBinding(4, 12);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glClear(GL_COLOR_BUFFER_BIT);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 0, 0);
		glDisableVertexAttribArray(4);
		glVertexAttribI4i(4, 0, 0, 0, 0);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 4.0, 5.0, 6.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 1, 2);

		glBindVertexArray(m_vao[1]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0.0f, 1.0f, 1.0f)))
			status = false;
		if (!status)
			return ERROR;

		return NO_ERROR;
	}